

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *
__thiscall
Parser::parseCallArgumentList_abi_cxx11_
          (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
           *__return_storage_ptr__,Parser *this)

{
  Token *pTVar1;
  shared_ptr<ExpressionNode> arg;
  Token token;
  __shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  Token local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token,"Expected open parenthesis!",(allocator<char> *)&arg);
  expectToken(this,LParen,(string *)&token);
  std::__cxx11::string::~string((string *)&token);
  (__return_storage_ptr__->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  )._M_impl._M_node._M_size = 0;
  pTVar1 = Tokenizer::peek(&this->tokenizer_);
  Token::Token(&token,pTVar1);
  if (token.type != RParen) {
    parseCallArgument((Parser *)&arg);
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    push_back(__return_storage_ptr__,&arg);
    pTVar1 = Tokenizer::peek(&this->tokenizer_);
    Token::operator=(&token,pTVar1);
    while (token.type == Comma) {
      Tokenizer::nextToken(&local_68,&this->tokenizer_);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_68.value);
      parseCallArgument((Parser *)&local_78);
      std::__shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&arg.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>,&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      std::__cxx11::
      list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
      push_back(__return_storage_ptr__,
                (value_type *)&arg.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>);
      pTVar1 = Tokenizer::peek(&this->tokenizer_);
      Token::operator=(&token,pTVar1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,"Expected closing parenthesis!",(allocator<char> *)&local_78);
  expectToken(this,RParen,(string *)&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&token.value);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::shared_ptr<ExpressionNode>> Parser::parseCallArgumentList()
{
  expectToken(TokenType::LParen, "Expected open parenthesis!");
  std::list<std::shared_ptr<ExpressionNode>> arguments{};
  auto token = tokenizer_.peek();
  if(token.type != TokenType::RParen)
  {
    auto arg = parseCallArgument();
    arguments.push_back(std::move(arg));
    token = tokenizer_.peek();
    while(token.type == TokenType::Comma)
    {
      tokenizer_.nextToken();
      arg = parseCallArgument();
      arguments.push_back(std::move(arg));
      token = tokenizer_.peek();
    }
  }
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  return arguments;
}